

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O3

bool __thiscall antlr::BaseAST::equalsTree(BaseAST *this,RefAST *t)

{
  bool bVar1;
  int iVar2;
  AST *pAVar3;
  ASTRefCount<antlr::AST> local_38;
  ASTRefCount<antlr::AST> local_30;
  ASTRefCount<antlr::AST> local_28;
  
  local_28.ref = t->ref;
  if (local_28.ref != (ASTRef *)0x0) {
    (local_28.ref)->count = (local_28.ref)->count + 1;
  }
  iVar2 = (*(this->super_AST)._vptr_AST[4])(this);
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_28);
  if ((char)iVar2 == '\0') {
LAB_001670c0:
    bVar1 = false;
  }
  else {
    (*(this->super_AST)._vptr_AST[0xd])(&local_38,this);
    if (local_38.ref == (ASTRef *)0x0) {
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
LAB_0016704c:
      (*t->ref->ptr->_vptr_AST[0xd])(&local_38);
      if (local_38.ref == (ASTRef *)0x0) {
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
      }
      else {
        pAVar3 = (local_38.ref)->ptr;
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
        if (pAVar3 != (AST *)0x0) goto LAB_001670c0;
      }
    }
    else {
      pAVar3 = (local_38.ref)->ptr;
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
      if (pAVar3 == (AST *)0x0) goto LAB_0016704c;
      (*(this->super_AST)._vptr_AST[0xd])(&local_38,this);
      if (local_38.ref == (ASTRef *)0x0) {
        pAVar3 = (AST *)0x0;
      }
      else {
        pAVar3 = (local_38.ref)->ptr;
      }
      (*t->ref->ptr->_vptr_AST[0xd])(&local_30);
      iVar2 = (*pAVar3->_vptr_AST[5])(pAVar3,&local_30);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_30);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
      if ((char)iVar2 == '\0') goto LAB_001670c0;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool BaseAST::equalsTree(RefAST t) const
{
	// check roots first
	if (!equals(t))
		return false;
	// if roots match, do full list match test on children.
	if (getFirstChild()) {
		if (!getFirstChild()->equalsList(t->getFirstChild()))
			return false;
	}
	// sibling has no kids, make sure t doesn't either
	else if (t->getFirstChild())
		return false;

	return true;
}